

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O2

bool Minisat::find_executable(char *name)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *__dest;
  char *__s;
  size_t size;
  
  sVar3 = strlen(name);
  pcVar4 = getenv("PATH");
  if (pcVar4 == (char *)0x0) {
    bVar2 = false;
  }
  else {
    sVar5 = strlen(pcVar4);
    bVar2 = false;
    __dest = (char *)xrealloc((void *)0x0,sVar5 + 1);
    if (__dest != (char *)0x0) {
      strcpy(__dest,pcVar4);
      bVar2 = false;
      pcVar4 = __dest;
      while ((bVar2 == false && (size = sVar3 + 2, pcVar1 = pcVar4, pcVar4 != __dest + sVar5 + 1)))
      {
        while( true ) {
          if ((*pcVar1 == '\0') || (*pcVar1 == ':')) break;
          size = size + 1;
          pcVar1 = pcVar1 + 1;
        }
        *pcVar1 = '\0';
        bVar2 = false;
        __s = (char *)xrealloc((void *)0x0,size);
        if (__s == (char *)0x0) break;
        sprintf(__s,"%s/%s",pcVar4,name);
        bVar2 = file_readable(__s);
        free(__s);
        pcVar4 = pcVar1 + 1;
      }
      free(__dest);
    }
  }
  return bVar2;
}

Assistant:

inline bool find_executable(const char *name)
{
    const size_t name_len = strlen(name);
    const char *environment = getenv("PATH");
    if (!environment) return false;
    const size_t dirs_len = strlen(environment);
    char *dirs = (char *)xrealloc(NULL, dirs_len + 1);
    if (!dirs) return false;
    strcpy(dirs, environment);
    bool res = false;
    const char *end = dirs + dirs_len + 1;
    for (char *dir = dirs, *q; !res && dir != end; dir = q) {
        for (q = dir; *q && *q != ':'; q++) assert(q + 1 < end);
        *q++ = 0;
        const size_t path_len = (q - dir) + name_len;
        char *path = (char *)xrealloc(NULL, path_len + 1);
        if (!path) {
            free(dirs);
            return false;
        }
        sprintf(path, "%s/%s", dir, name);
        assert(strlen(path) == path_len);
        res = file_readable(path);
        free(path);
    }
    free(dirs);
    return res;
}